

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O3

int Ssw_SecGeneralMiter(Aig_Man_t *pMiter,Ssw_Pars_t *pPars)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  long lVar3;
  long lVar4;
  char *format;
  int level;
  Aig_Man_t *pAVar5;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  p = Ssw_SignalCorrespondence(pMiter,pPars);
  pAVar5 = p;
  iVar1 = Ssw_MiterStatus(p,1);
  iVar2 = (int)pAVar5;
  if (iVar1 == 0) {
    format = "Verification failed with a counter-example.  ";
  }
  else {
    if (iVar1 != 1) {
      Abc_Print(iVar2,"Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
                (ulong)(uint)p->nRegs,(ulong)(uint)pMiter->nRegs);
      goto LAB_0061e7c8;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(iVar2,format);
LAB_0061e7c8:
  Abc_Print(iVar2,"%s =","Time");
  level = 3;
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  Aig_ManStop(p);
  return iVar1;
}

Assistant:

int Ssw_SecGeneralMiter( Aig_Man_t * pMiter, Ssw_Pars_t * pPars )
{
    Aig_Man_t * pAigRes;
    int RetValue;
    abctime clk = Abc_Clock();
    // try the new AIGs
//    Abc_Print( 1, "Performing general verification without node pairs.\n" );
    pAigRes = Ssw_SignalCorrespondence( pMiter, pPars );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with a counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. The number of remaining regs = %d (total = %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pMiter) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigRes );
    return RetValue;
}